

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

expected<void,_std::errc> __thiscall
async_simple::coro::detail::LazyAwaiterBase<tl::expected<void,_std::errc>_>::awaitResume
          (LazyAwaiterBase<tl::expected<void,_std::errc>_> *this)

{
  expected_storage_base<void,_std::errc,_false,_true> eVar1;
  expected<void,_std::errc> *peVar2;
  
  peVar2 = LazyPromise<tl::expected<void,_std::errc>_>::result
                     ((LazyPromise<tl::expected<void,_std::errc>_> *)
                      ((long)(this->_handle).__handle_ + 0x10));
  eVar1 = (peVar2->super_expected_move_assign_base<void,_std::errc,_true>).
          super_expected_copy_assign_base<void,_std::errc,_true>.
          super_expected_move_base<void,_std::errc,_true>.
          super_expected_copy_base<void,_std::errc,_true>.
          super_expected_operations_base<void,_std::errc>.
          super_expected_storage_base<void,_std::errc,_false,_true>;
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  return (expected<void,_std::errc>)eVar1;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }